

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlDumpElementContent(xmlBufferPtr buf,xmlElementContentPtr content)

{
  xmlElementContentType xVar1;
  _xmlElementContent *p_Var2;
  bool bVar3;
  xmlElementContentPtr parent;
  xmlElementContentPtr cur;
  xmlElementContentPtr content_local;
  xmlBufferPtr buf_local;
  
  if (content != (xmlElementContentPtr)0x0) {
    xmlBufferWriteChar(buf,"(");
    parent = content;
    do {
      if (parent == (xmlElementContentPtr)0x0) {
        return;
      }
      xVar1 = parent->type;
      if (xVar1 == XML_ELEMENT_CONTENT_PCDATA) {
        xmlBufferWriteChar(buf,"#PCDATA");
LAB_001d019a:
        do {
          if (parent == content) goto LAB_001d0268;
          p_Var2 = parent->parent;
          if (p_Var2 == (_xmlElementContent *)0x0) {
            return;
          }
          if (((parent->type == XML_ELEMENT_CONTENT_OR) || (parent->type == XML_ELEMENT_CONTENT_SEQ)
              ) && ((parent->type != p_Var2->type || (parent->ocur != XML_ELEMENT_CONTENT_ONCE)))) {
            xmlBufferWriteChar(buf,")");
          }
          xmlDumpElementOccur(buf,parent);
          bVar3 = parent != p_Var2->c1;
          parent = p_Var2;
        } while (bVar3);
        if (p_Var2->type == XML_ELEMENT_CONTENT_SEQ) {
          xmlBufferWriteChar(buf," , ");
        }
        else if (p_Var2->type == XML_ELEMENT_CONTENT_OR) {
          xmlBufferWriteChar(buf," | ");
        }
        parent = p_Var2->c2;
      }
      else {
        if (xVar1 == XML_ELEMENT_CONTENT_ELEMENT) {
          if (parent->prefix != (xmlChar *)0x0) {
            xmlBufferWriteCHAR(buf,parent->prefix);
            xmlBufferWriteChar(buf,":");
          }
          xmlBufferWriteCHAR(buf,parent->name);
          goto LAB_001d019a;
        }
        if (1 < xVar1 - XML_ELEMENT_CONTENT_SEQ) {
          xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,
                      "Internal: ELEMENT cur corrupted invalid type\n",(char *)0x0);
          goto LAB_001d019a;
        }
        if (((parent != content) && (parent->parent != (_xmlElementContent *)0x0)) &&
           ((parent->type != parent->parent->type || (parent->ocur != XML_ELEMENT_CONTENT_ONCE)))) {
          xmlBufferWriteChar(buf,"(");
        }
        parent = parent->c1;
      }
LAB_001d0268:
    } while (parent != content);
    xmlBufferWriteChar(buf,")");
    xmlDumpElementOccur(buf,content);
  }
  return;
}

Assistant:

static void
xmlDumpElementContent(xmlBufferPtr buf, xmlElementContentPtr content) {
    xmlElementContentPtr cur;

    if (content == NULL) return;

    xmlBufferWriteChar(buf, "(");
    cur = content;

    do {
        if (cur == NULL) return;

        switch (cur->type) {
            case XML_ELEMENT_CONTENT_PCDATA:
                xmlBufferWriteChar(buf, "#PCDATA");
                break;
            case XML_ELEMENT_CONTENT_ELEMENT:
                if (cur->prefix != NULL) {
                    xmlBufferWriteCHAR(buf, cur->prefix);
                    xmlBufferWriteChar(buf, ":");
                }
                xmlBufferWriteCHAR(buf, cur->name);
                break;
            case XML_ELEMENT_CONTENT_SEQ:
            case XML_ELEMENT_CONTENT_OR:
                if ((cur != content) &&
                    (cur->parent != NULL) &&
                    ((cur->type != cur->parent->type) ||
                     (cur->ocur != XML_ELEMENT_CONTENT_ONCE)))
                    xmlBufferWriteChar(buf, "(");
                cur = cur->c1;
                continue;
            default:
                xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
                        "Internal: ELEMENT cur corrupted invalid type\n",
                        NULL);
        }

        while (cur != content) {
            xmlElementContentPtr parent = cur->parent;

            if (parent == NULL) return;

            if (((cur->type == XML_ELEMENT_CONTENT_OR) ||
                 (cur->type == XML_ELEMENT_CONTENT_SEQ)) &&
                ((cur->type != parent->type) ||
                 (cur->ocur != XML_ELEMENT_CONTENT_ONCE)))
                xmlBufferWriteChar(buf, ")");
            xmlDumpElementOccur(buf, cur);

            if (cur == parent->c1) {
                if (parent->type == XML_ELEMENT_CONTENT_SEQ)
                    xmlBufferWriteChar(buf, " , ");
                else if (parent->type == XML_ELEMENT_CONTENT_OR)
                    xmlBufferWriteChar(buf, " | ");

                cur = parent->c2;
                break;
            }

            cur = parent;
        }
    } while (cur != content);

    xmlBufferWriteChar(buf, ")");
    xmlDumpElementOccur(buf, content);
}